

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_TestHeapTypeRelations_Test::TestBody
          (IsorecursiveTest_TestHeapTypeRelations_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Field> __l_01;
  initializer_list<wasm::Field> __l_02;
  initializer_list<wasm::Field> __l_03;
  initializer_list<wasm::Field> __l_04;
  initializer_list<wasm::Field> __l_05;
  initializer_list<wasm::Field> __l_06;
  initializer_list<wasm::Field> __l_07;
  initializer_list<wasm::Field> __l_08;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  HeapType HVar4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar5;
  reference pvVar6;
  Type TVar7;
  undefined8 extraout_RDX;
  char *in_R9;
  Entry EVar8;
  Array AVar9;
  optional<wasm::HeapType> lub;
  optional<wasm::HeapType> lub_00;
  optional<wasm::HeapType> lub_01;
  optional<wasm::HeapType> lub_02;
  optional<wasm::HeapType> lub_03;
  optional<wasm::HeapType> lub_04;
  optional<wasm::HeapType> lub_05;
  optional<wasm::HeapType> lub_06;
  optional<wasm::HeapType> lub_07;
  optional<wasm::HeapType> lub_08;
  optional<wasm::HeapType> lub_09;
  optional<wasm::HeapType> lub_10;
  optional<wasm::HeapType> lub_11;
  optional<wasm::HeapType> lub_12;
  optional<wasm::HeapType> lub_13;
  optional<wasm::HeapType> lub_14;
  optional<wasm::HeapType> lub_15;
  optional<wasm::HeapType> lub_16;
  optional<wasm::HeapType> lub_17;
  optional<wasm::HeapType> lub_18;
  optional<wasm::HeapType> lub_19;
  optional<wasm::HeapType> lub_20;
  optional<wasm::HeapType> lub_21;
  optional<wasm::HeapType> lub_22;
  optional<wasm::HeapType> lub_23;
  optional<wasm::HeapType> lub_24;
  optional<wasm::HeapType> lub_25;
  optional<wasm::HeapType> lub_26;
  optional<wasm::HeapType> lub_27;
  optional<wasm::HeapType> lub_28;
  optional<wasm::HeapType> lub_29;
  optional<wasm::HeapType> lub_30;
  optional<wasm::HeapType> lub_31;
  optional<wasm::HeapType> lub_32;
  optional<wasm::HeapType> lub_33;
  optional<wasm::HeapType> lub_34;
  optional<wasm::HeapType> lub_35;
  optional<wasm::HeapType> lub_36;
  optional<wasm::HeapType> lub_37;
  optional<wasm::HeapType> lub_38;
  optional<wasm::HeapType> lub_39;
  optional<wasm::HeapType> lub_40;
  optional<wasm::HeapType> lub_41;
  optional<wasm::HeapType> lub_42;
  optional<wasm::HeapType> lub_43;
  optional<wasm::HeapType> lub_44;
  optional<wasm::HeapType> lub_45;
  optional<wasm::HeapType> lub_46;
  optional<wasm::HeapType> lub_47;
  optional<wasm::HeapType> lub_48;
  optional<wasm::HeapType> lub_49;
  optional<wasm::HeapType> lub_50;
  optional<wasm::HeapType> lub_51;
  optional<wasm::HeapType> lub_52;
  optional<wasm::HeapType> lub_53;
  optional<wasm::HeapType> lub_54;
  optional<wasm::HeapType> lub_55;
  optional<wasm::HeapType> lub_56;
  optional<wasm::HeapType> lub_57;
  optional<wasm::HeapType> lub_58;
  optional<wasm::HeapType> lub_59;
  optional<wasm::HeapType> lub_60;
  optional<wasm::HeapType> lub_61;
  optional<wasm::HeapType> lub_62;
  optional<wasm::HeapType> lub_63;
  optional<wasm::HeapType> lub_64;
  optional<wasm::HeapType> lub_65;
  optional<wasm::HeapType> lub_66;
  optional<wasm::HeapType> lub_67;
  optional<wasm::HeapType> lub_68;
  optional<wasm::HeapType> lub_69;
  optional<wasm::HeapType> lub_70;
  optional<wasm::HeapType> lub_71;
  optional<wasm::HeapType> lub_72;
  optional<wasm::HeapType> lub_73;
  optional<wasm::HeapType> lub_74;
  optional<wasm::HeapType> lub_75;
  optional<wasm::HeapType> lub_76;
  optional<wasm::HeapType> lub_77;
  optional<wasm::HeapType> lub_78;
  optional<wasm::HeapType> lub_79;
  optional<wasm::HeapType> lub_80;
  optional<wasm::HeapType> lub_81;
  optional<wasm::HeapType> lub_82;
  optional<wasm::HeapType> lub_83;
  optional<wasm::HeapType> lub_84;
  optional<wasm::HeapType> lub_85;
  optional<wasm::HeapType> lub_86;
  optional<wasm::HeapType> lub_87;
  optional<wasm::HeapType> lub_88;
  optional<wasm::HeapType> lub_89;
  optional<wasm::HeapType> lub_90;
  optional<wasm::HeapType> lub_91;
  optional<wasm::HeapType> lub_92;
  optional<wasm::HeapType> lub_93;
  optional<wasm::HeapType> lub_94;
  optional<wasm::HeapType> lub_95;
  optional<wasm::HeapType> lub_96;
  optional<wasm::HeapType> lub_97;
  optional<wasm::HeapType> lub_98;
  optional<wasm::HeapType> lub_99;
  optional<wasm::HeapType> lub_x00100;
  optional<wasm::HeapType> lub_x00101;
  optional<wasm::HeapType> lub_x00102;
  optional<wasm::HeapType> lub_x00103;
  optional<wasm::HeapType> lub_x00104;
  optional<wasm::HeapType> lub_x00105;
  optional<wasm::HeapType> lub_x00106;
  optional<wasm::HeapType> lub_x00107;
  optional<wasm::HeapType> lub_x00108;
  optional<wasm::HeapType> lub_x00109;
  optional<wasm::HeapType> lub_x00110;
  optional<wasm::HeapType> lub_x00111;
  optional<wasm::HeapType> lub_x00112;
  optional<wasm::HeapType> lub_x00113;
  optional<wasm::HeapType> lub_x00114;
  optional<wasm::HeapType> lub_x00115;
  optional<wasm::HeapType> lub_x00116;
  optional<wasm::HeapType> lub_x00117;
  optional<wasm::HeapType> lub_x00118;
  optional<wasm::HeapType> lub_x00119;
  optional<wasm::HeapType> lub_x00120;
  optional<wasm::HeapType> lub_x00121;
  optional<wasm::HeapType> lub_x00122;
  optional<wasm::HeapType> lub_x00123;
  optional<wasm::HeapType> lub_x00124;
  optional<wasm::HeapType> lub_x00125;
  optional<wasm::HeapType> lub_x00126;
  optional<wasm::HeapType> lub_x00127;
  optional<wasm::HeapType> lub_x00128;
  optional<wasm::HeapType> lub_x00129;
  optional<wasm::HeapType> lub_x00130;
  optional<wasm::HeapType> lub_x00131;
  optional<wasm::HeapType> lub_x00132;
  optional<wasm::HeapType> lub_x00133;
  optional<wasm::HeapType> lub_x00134;
  optional<wasm::HeapType> lub_x00135;
  optional<wasm::HeapType> lub_x00136;
  optional<wasm::HeapType> lub_x00137;
  optional<wasm::HeapType> lub_x00138;
  optional<wasm::HeapType> lub_x00139;
  optional<wasm::HeapType> lub_x00140;
  optional<wasm::HeapType> lub_x00141;
  optional<wasm::HeapType> lub_x00142;
  optional<wasm::HeapType> lub_x00143;
  optional<wasm::HeapType> lub_x00144;
  optional<wasm::HeapType> lub_x00145;
  optional<wasm::HeapType> lub_x00146;
  optional<wasm::HeapType> lub_x00147;
  optional<wasm::HeapType> lub_x00148;
  optional<wasm::HeapType> lub_x00149;
  optional<wasm::HeapType> lub_x00150;
  optional<wasm::HeapType> lub_x00151;
  string local_2028;
  AssertHelper local_2008;
  Message local_2000;
  uintptr_t local_1ff8;
  HeapType local_1ff0;
  bool local_1fe1;
  undefined1 local_1fe0 [8];
  AssertionResult gtest_ar__12;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_4;
  AssertHelper local_1f98;
  Message local_1f90;
  undefined1 local_1f88 [8];
  AssertionResult gtest_ar__11;
  BuildResult results_4;
  Entry local_1f40;
  Entry local_1f30;
  allocator<wasm::Field> local_1f19;
  uintptr_t local_1f18;
  Field local_1f10;
  iterator local_1f00;
  size_type local_1ef8;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1ef0;
  Struct local_1ed8;
  Entry local_1ec0;
  allocator<wasm::Field> local_1ea9;
  uintptr_t local_1ea8;
  Field local_1ea0;
  iterator local_1e90;
  size_type local_1e88;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1e80;
  Struct local_1e68;
  Entry local_1e50;
  uintptr_t local_1e40;
  Type local_1e38;
  Type ref1_1;
  Type ref0_1;
  TypeBuilder builder_4;
  AssertHelper local_1de8;
  Message local_1de0;
  uintptr_t local_1dd8;
  HeapType local_1dd0;
  bool local_1dc1;
  undefined1 local_1dc0 [8];
  AssertionResult gtest_ar__10;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_3;
  AssertHelper local_1d78;
  Message local_1d70;
  undefined1 local_1d68 [8];
  AssertionResult gtest_ar__9;
  BuildResult results_3;
  Entry local_1d20;
  Entry local_1d10;
  uintptr_t local_1d00;
  Entry local_1cf8;
  Entry local_1ce8;
  allocator<wasm::Field> local_1cd1;
  uintptr_t local_1cd0;
  Field local_1cc8;
  iterator local_1cb8;
  size_type local_1cb0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1ca8;
  Struct local_1c90;
  Entry local_1c78;
  allocator<wasm::Field> local_1c61;
  uintptr_t local_1c60;
  Field local_1c58;
  iterator local_1c48;
  size_type local_1c40;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1c38;
  Struct local_1c20;
  Entry local_1c08;
  allocator<wasm::Field> local_1bf1;
  uintptr_t local_1bf0;
  Field local_1be8;
  iterator local_1bd8;
  size_type local_1bd0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1bc8;
  Struct local_1bb0;
  Entry local_1b98;
  allocator<wasm::Field> local_1b81;
  uintptr_t local_1b80;
  Field local_1b78;
  iterator local_1b68;
  size_type local_1b60;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1b58;
  Struct local_1b40;
  Entry local_1b28;
  uintptr_t local_1b18;
  Type local_1b10;
  Type ref1;
  Type ref0;
  TypeBuilder builder_3;
  AssertHelper local_1ac0;
  Message local_1ab8;
  uintptr_t local_1ab0;
  HeapType local_1aa8;
  bool local_1a99;
  undefined1 local_1a98 [8];
  AssertionResult gtest_ar__8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_2;
  AssertHelper local_1a50;
  Message local_1a48;
  undefined1 local_1a40 [8];
  AssertionResult gtest_ar__7;
  BuildResult results_2;
  Entry local_19f8;
  Entry local_19e8;
  allocator<wasm::Field> local_19d1;
  uintptr_t local_19d0;
  uintptr_t local_19c8;
  Field local_19c0;
  Field local_19b0;
  iterator local_19a0;
  size_type local_1998;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1990;
  Struct local_1978;
  Entry local_1960;
  allocator<wasm::Field> local_1949;
  uintptr_t local_1948;
  Field local_1940;
  iterator local_1930;
  size_type local_1928;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1920;
  Struct local_1908;
  TypeBuilder local_18f0;
  TypeBuilder builder_2;
  AssertHelper local_18c8;
  Message local_18c0;
  uintptr_t local_18b8;
  HeapType local_18b0;
  bool local_18a1;
  undefined1 local_18a0 [8];
  AssertionResult gtest_ar__6;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_1;
  AssertHelper local_1858;
  Message local_1850;
  undefined1 local_1848 [8];
  AssertionResult gtest_ar__5;
  BuildResult results_1;
  Entry local_1800;
  Entry local_17f0;
  allocator<wasm::Field> local_17d9;
  uintptr_t local_17d8;
  Field local_17d0;
  iterator local_17c0;
  size_type local_17b8;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_17b0;
  Struct local_1798;
  Entry local_1780;
  allocator<wasm::Field> local_1769;
  uintptr_t local_1768;
  Field local_1760;
  iterator local_1750;
  size_type local_1748;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1740;
  Struct local_1728;
  TypeBuilder local_1710;
  TypeBuilder builder_1;
  AssertHelper local_16e8;
  Message local_16e0;
  uintptr_t local_16d8;
  HeapType local_16d0;
  bool local_16c1;
  undefined1 local_16c0 [8];
  AssertionResult gtest_ar__4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_1690;
  AssertHelper local_1670;
  Message local_1668;
  undefined1 local_1660 [8];
  AssertionResult gtest_ar__3;
  BuildResult results;
  Entry local_1618;
  Entry local_1608;
  uintptr_t local_15f8;
  Field local_15f0;
  Array local_15e0;
  Entry local_15d0;
  uintptr_t local_15c0;
  Field local_15b8;
  Array local_15a8;
  TypeBuilder local_1598;
  TypeBuilder builder;
  Message local_1588;
  uintptr_t local_1580;
  uintptr_t local_1578;
  Type local_1570;
  undefined1 local_1568 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1538;
  Message local_1530;
  uintptr_t local_1528;
  uintptr_t local_1520;
  bool local_1511;
  undefined1 local_1510 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_14e0;
  Message local_14d8;
  uintptr_t local_14d0;
  uintptr_t local_14c8;
  bool local_14b9;
  undefined1 local_14b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1488;
  Message local_1480;
  uintptr_t local_1478;
  uintptr_t local_1470;
  bool local_1461;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar_;
  Type local_1448;
  Type nonNullable;
  Type local_1438;
  Type eqref;
  Type local_1428;
  Type anyref;
  undefined1 local_1418;
  undefined3 uStack_1417;
  undefined1 local_1400 [12];
  HeapType local_13f0;
  HeapType local_13e8;
  undefined1 local_13e0 [12];
  HeapType local_13d0;
  HeapType local_13c8;
  undefined1 local_13c0 [12];
  HeapType local_13b0;
  HeapType local_13a8;
  undefined1 local_13a0 [12];
  HeapType local_1390;
  HeapType local_1388;
  undefined1 local_1380 [12];
  HeapType local_1370;
  HeapType local_1368;
  undefined1 local_1360 [12];
  HeapType local_1350;
  HeapType local_1348;
  undefined1 local_1340 [12];
  HeapType local_1330;
  HeapType local_1328;
  undefined1 local_1320 [12];
  HeapType local_1310;
  HeapType local_1308;
  undefined1 local_1300 [12];
  HeapType local_12f0;
  HeapType local_12e8;
  undefined1 local_12e0 [12];
  HeapType local_12d0;
  HeapType local_12c8;
  undefined1 local_12c0 [12];
  HeapType local_12b0;
  HeapType local_12a8;
  undefined1 local_12a0 [12];
  HeapType local_1290;
  HeapType local_1288;
  undefined1 local_1280 [12];
  HeapType local_1270;
  HeapType local_1268;
  undefined1 local_1260 [12];
  HeapType local_1250;
  HeapType local_1248;
  undefined1 local_1240 [12];
  HeapType local_1230;
  HeapType local_1228;
  undefined1 local_1220 [12];
  HeapType local_1210;
  HeapType local_1208;
  undefined1 local_1200 [12];
  HeapType local_11f0;
  HeapType local_11e8;
  undefined1 local_11e0 [12];
  HeapType local_11d0;
  HeapType local_11c8;
  undefined1 local_11c0 [12];
  HeapType local_11b0;
  HeapType local_11a8;
  undefined1 local_11a0 [12];
  HeapType local_1190;
  HeapType local_1188;
  undefined1 local_1180 [12];
  HeapType local_1170;
  HeapType local_1168;
  undefined1 local_1160 [12];
  HeapType local_1150;
  HeapType local_1148;
  undefined1 local_1140 [12];
  HeapType local_1130;
  HeapType local_1128;
  undefined1 local_1120 [12];
  HeapType local_1110;
  HeapType local_1108;
  undefined1 local_1100 [12];
  HeapType local_10f0;
  HeapType local_10e8;
  undefined1 local_10e0 [12];
  HeapType local_10d0;
  HeapType local_10c8;
  undefined1 local_10c0 [12];
  HeapType local_10b0;
  HeapType local_10a8;
  undefined1 local_10a0 [12];
  HeapType local_1090;
  HeapType local_1088;
  undefined1 local_1080 [12];
  HeapType local_1070;
  HeapType local_1068;
  undefined1 local_1060 [12];
  HeapType local_1050;
  HeapType local_1048;
  undefined1 local_1040 [12];
  HeapType local_1030;
  HeapType local_1028;
  undefined1 local_1020 [12];
  HeapType local_1010;
  HeapType local_1008;
  undefined1 local_1000 [12];
  HeapType local_ff0;
  HeapType local_fe8;
  undefined1 local_fe0 [12];
  HeapType local_fd0;
  HeapType local_fc8;
  undefined1 local_fc0 [12];
  HeapType local_fb0;
  HeapType local_fa8;
  undefined1 local_fa0 [12];
  HeapType local_f90;
  HeapType local_f88;
  undefined1 local_f80 [12];
  HeapType local_f70;
  HeapType local_f68;
  undefined1 local_f60 [12];
  HeapType local_f50;
  HeapType local_f48;
  undefined1 local_f40 [12];
  HeapType local_f30;
  HeapType local_f28;
  undefined1 local_f20 [12];
  HeapType local_f10;
  HeapType local_f08;
  undefined1 local_f00 [12];
  HeapType local_ef0;
  HeapType local_ee8;
  undefined1 local_ee0 [12];
  HeapType local_ed0;
  HeapType local_ec8;
  undefined1 local_ec0 [12];
  HeapType local_eb0;
  HeapType local_ea8;
  undefined1 local_ea0 [12];
  HeapType local_e90;
  HeapType local_e88;
  undefined1 local_e80 [12];
  HeapType local_e70;
  HeapType local_e68;
  undefined1 local_e60 [12];
  HeapType local_e50;
  HeapType local_e48;
  undefined1 local_e40 [12];
  HeapType local_e30;
  HeapType local_e28;
  undefined1 local_e20 [12];
  HeapType local_e10;
  HeapType local_e08;
  undefined1 local_e00 [12];
  HeapType local_df0;
  HeapType local_de8;
  undefined1 local_de0 [12];
  HeapType local_dd0;
  HeapType local_dc8;
  undefined1 local_dc0 [12];
  HeapType local_db0;
  HeapType local_da8;
  undefined1 local_da0 [12];
  HeapType local_d90;
  HeapType local_d88;
  undefined1 local_d80 [12];
  HeapType local_d70;
  HeapType local_d68;
  undefined1 local_d60 [12];
  HeapType local_d50;
  HeapType local_d48;
  undefined1 local_d40 [12];
  HeapType local_d30;
  HeapType local_d28;
  undefined1 local_d20 [12];
  HeapType local_d10;
  HeapType local_d08;
  undefined1 local_d00 [12];
  HeapType local_cf0;
  HeapType local_ce8;
  undefined1 local_ce0 [12];
  HeapType local_cd0;
  HeapType local_cc8;
  undefined1 local_cc0 [12];
  HeapType local_cb0;
  HeapType local_ca8;
  undefined1 local_ca0 [12];
  HeapType local_c90;
  HeapType local_c88;
  undefined1 local_c80 [12];
  HeapType local_c70;
  HeapType local_c68;
  undefined1 local_c60 [12];
  HeapType local_c50;
  HeapType local_c48;
  undefined1 local_c40 [12];
  HeapType local_c30;
  HeapType local_c28;
  undefined1 local_c20 [12];
  HeapType local_c10;
  HeapType local_c08;
  undefined1 local_c00 [12];
  HeapType local_bf0;
  HeapType local_be8;
  undefined1 local_be0 [12];
  HeapType local_bd0;
  HeapType local_bc8;
  undefined1 local_bc0 [12];
  HeapType local_bb0;
  HeapType local_ba8;
  undefined1 local_ba0 [12];
  HeapType local_b90;
  HeapType local_b88;
  undefined1 local_b80 [12];
  HeapType local_b70;
  HeapType local_b68;
  undefined1 local_b60 [12];
  HeapType local_b50;
  HeapType local_b48;
  undefined1 local_b40 [12];
  HeapType local_b30;
  HeapType local_b28;
  undefined1 local_b20 [12];
  HeapType local_b10;
  HeapType local_b08;
  undefined1 local_b00 [12];
  HeapType local_af0;
  HeapType local_ae8;
  undefined1 local_ae0 [12];
  HeapType local_ad0;
  HeapType local_ac8;
  undefined1 local_ac0 [12];
  HeapType local_ab0;
  HeapType local_aa8;
  undefined1 local_aa0 [12];
  HeapType local_a90;
  HeapType local_a88;
  undefined1 local_a80 [12];
  HeapType local_a70;
  HeapType local_a68;
  undefined1 local_a60 [12];
  HeapType local_a50;
  HeapType local_a48;
  undefined1 local_a40 [12];
  HeapType local_a30;
  HeapType local_a28;
  undefined1 local_a20 [12];
  HeapType local_a10;
  HeapType local_a08;
  undefined1 local_a00 [12];
  HeapType local_9f0;
  HeapType local_9e8;
  undefined1 local_9e0 [12];
  HeapType local_9d0;
  HeapType local_9c8;
  undefined1 local_9c0 [12];
  HeapType local_9b0;
  HeapType local_9a8;
  undefined1 local_9a0 [12];
  HeapType local_990;
  HeapType local_988;
  undefined1 local_980 [12];
  HeapType local_970;
  HeapType local_968;
  undefined1 local_960 [12];
  HeapType local_950;
  HeapType local_948;
  undefined1 local_940 [12];
  HeapType local_930;
  HeapType local_928;
  undefined1 local_920 [12];
  HeapType local_910;
  HeapType local_908;
  undefined1 local_900 [12];
  HeapType local_8f0;
  HeapType local_8e8;
  undefined1 local_8e0 [12];
  HeapType local_8d0;
  HeapType local_8c8;
  undefined1 local_8c0 [12];
  HeapType local_8b0;
  HeapType local_8a8;
  undefined1 local_8a0 [12];
  HeapType local_890;
  HeapType local_888;
  undefined1 local_880 [12];
  HeapType local_870;
  HeapType local_868;
  undefined1 local_860 [12];
  HeapType local_850;
  HeapType local_848;
  undefined1 local_840 [12];
  HeapType local_830;
  HeapType local_828;
  undefined1 local_820 [12];
  HeapType local_810;
  HeapType local_808;
  undefined1 local_800 [12];
  HeapType local_7f0;
  HeapType local_7e8;
  undefined1 local_7e0 [12];
  HeapType local_7d0;
  HeapType local_7c8;
  undefined1 local_7c0 [12];
  HeapType local_7b0;
  HeapType local_7a8;
  undefined1 local_7a0 [12];
  HeapType local_790;
  HeapType local_788;
  undefined1 local_780 [12];
  HeapType local_770;
  HeapType local_768;
  undefined1 local_760 [12];
  HeapType local_750;
  HeapType local_748;
  undefined1 local_740 [12];
  HeapType local_730;
  HeapType local_728;
  undefined1 local_720 [12];
  HeapType local_710;
  HeapType local_708;
  undefined1 local_700 [12];
  HeapType local_6f0;
  HeapType local_6e8;
  undefined1 local_6e0 [12];
  HeapType local_6d0;
  HeapType local_6c8;
  undefined1 local_6c0 [12];
  HeapType local_6b0;
  HeapType local_6a8;
  undefined1 local_6a0 [12];
  HeapType local_690;
  HeapType local_688;
  undefined1 local_680 [12];
  HeapType local_670;
  HeapType local_668;
  undefined1 local_660 [12];
  HeapType local_650;
  HeapType local_648;
  undefined1 local_640 [12];
  HeapType local_630;
  HeapType local_628;
  undefined1 local_620 [12];
  HeapType local_610;
  HeapType local_608;
  undefined1 local_600 [12];
  HeapType local_5f0;
  HeapType local_5e8;
  undefined1 local_5e0 [12];
  HeapType local_5d0;
  HeapType local_5c8;
  undefined1 local_5c0 [12];
  HeapType local_5b0;
  HeapType local_5a8;
  undefined1 local_5a0 [12];
  HeapType local_590;
  HeapType local_588;
  undefined1 local_580 [12];
  HeapType local_570;
  HeapType local_568;
  undefined1 local_560 [12];
  HeapType local_550;
  HeapType local_548;
  undefined1 local_540 [12];
  HeapType local_530;
  HeapType local_528;
  undefined1 local_520 [12];
  HeapType local_510;
  HeapType local_508;
  undefined1 local_500 [12];
  HeapType local_4f0;
  HeapType local_4e8;
  undefined1 local_4e0 [12];
  HeapType local_4d0;
  HeapType local_4c8;
  undefined1 local_4c0 [12];
  HeapType local_4b0;
  HeapType local_4a8;
  undefined1 local_4a0 [12];
  HeapType local_490;
  HeapType local_488;
  undefined1 local_480 [12];
  HeapType local_470;
  HeapType local_468;
  undefined1 local_460 [12];
  HeapType local_450;
  HeapType local_448;
  undefined1 local_440 [12];
  HeapType local_430;
  HeapType local_428;
  undefined1 local_420 [12];
  HeapType local_410;
  HeapType local_408;
  undefined1 local_400 [12];
  HeapType local_3f0;
  HeapType local_3e8;
  undefined1 local_3e0 [12];
  HeapType local_3d0;
  HeapType local_3c8;
  undefined1 local_3c0 [12];
  HeapType local_3b0;
  HeapType local_3a8;
  undefined1 local_3a0 [12];
  HeapType local_390;
  HeapType local_388;
  undefined1 local_380 [12];
  HeapType local_370;
  HeapType local_368;
  undefined1 local_360 [12];
  HeapType local_350;
  HeapType local_348;
  undefined1 local_340 [12];
  HeapType local_330;
  HeapType local_328;
  undefined1 local_320 [12];
  HeapType local_310;
  HeapType local_308;
  undefined1 local_300 [12];
  HeapType local_2f0;
  HeapType local_2e8;
  undefined1 local_2e0 [12];
  HeapType local_2d0;
  HeapType local_2c8;
  undefined1 local_2c0 [12];
  HeapType local_2b0;
  HeapType local_2a8;
  undefined1 local_2a0 [12];
  HeapType local_290;
  HeapType local_288;
  undefined1 local_280 [12];
  HeapType local_270;
  HeapType local_268;
  undefined1 local_260 [12];
  HeapType local_250;
  HeapType local_248;
  undefined1 local_240 [12];
  HeapType local_230;
  HeapType local_228;
  undefined1 local_220 [12];
  HeapType local_210;
  HeapType local_208;
  undefined1 local_200 [12];
  HeapType local_1f0;
  HeapType local_1e8;
  undefined1 local_1e0 [12];
  HeapType local_1d0;
  HeapType local_1c8;
  undefined1 local_1c0 [12];
  HeapType local_1b0;
  HeapType local_1a8;
  undefined1 local_1a0 [12];
  HeapType local_190;
  HeapType local_188;
  undefined1 local_180 [12];
  HeapType local_170;
  HeapType local_168;
  undefined1 local_160 [12];
  HeapType local_150;
  HeapType local_148;
  undefined1 local_140 [12];
  HeapType local_130;
  HeapType local_128;
  undefined1 local_120 [12];
  HeapType local_110;
  HeapType local_108;
  anon_class_1_0_00000001 local_f9;
  Type TStack_f8;
  anon_class_1_0_00000001 assertLUB;
  Field local_f0;
  undefined1 local_e0 [16];
  HeapType local_d0;
  HeapType defArray;
  Struct local_b8;
  HeapType local_a0;
  HeapType defStruct;
  HeapType local_88;
  HeapType defFunc;
  HeapType nofunc;
  HeapType noext;
  HeapType none;
  HeapType stringview_iter;
  HeapType stringview_wtf16;
  HeapType stringview_wtf8;
  HeapType string;
  HeapType array;
  HeapType struct_;
  HeapType i31;
  HeapType eq;
  HeapType any;
  HeapType func;
  HeapType ext;
  IsorecursiveTest_TestHeapTypeRelations_Test *this_local;
  
  wasm::HeapType::HeapType(&func,ext);
  wasm::HeapType::HeapType(&any,func);
  wasm::HeapType::HeapType(&eq,any);
  wasm::HeapType::HeapType(&i31,eq);
  wasm::HeapType::HeapType(&struct_,i31);
  wasm::HeapType::HeapType(&array,struct_);
  wasm::HeapType::HeapType(&string,array);
  wasm::HeapType::HeapType(&stringview_wtf8,string);
  wasm::HeapType::HeapType(&stringview_wtf16,stringview_wtf8);
  wasm::HeapType::HeapType(&stringview_iter,stringview_wtf16);
  wasm::HeapType::HeapType(&none,stringview_iter);
  wasm::HeapType::HeapType(&noext,none);
  wasm::HeapType::HeapType(&nofunc,noext);
  wasm::HeapType::HeapType(&defFunc,nofunc);
  wasm::Signature::Signature((Signature *)&defStruct);
  wasm::HeapType::HeapType(&local_88,_defStruct);
  local_b8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_b8);
  wasm::HeapType::HeapType(&local_a0,&local_b8);
  wasm::Struct::~Struct(&local_b8);
  wasm::Type::Type(&stack0xffffffffffffff08,i32);
  wasm::Field::Field(&local_f0,TStack_f8,Immutable);
  wasm::Array::Array((Array *)local_e0,local_f0);
  AVar9.element.packedType = (int)extraout_RDX;
  AVar9.element.mutable_ = (int)((ulong)extraout_RDX >> 0x20);
  AVar9.element.type.id = (uintptr_t)local_e0;
  wasm::HeapType::HeapType(&local_d0,AVar9);
  local_108.id = func.id;
  local_110.id = func.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_120,&func);
  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_120._0_8_;
  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_120[8];
  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_120._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_108,local_110,lub);
  local_128.id = func.id;
  local_130.id = any.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_140);
  lub_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_140._0_8_;
  lub_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_140[8];
  lub_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_140._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_128,local_130,lub_00);
  local_148.id = func.id;
  local_150.id = eq.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_160);
  lub_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_160._0_8_;
  lub_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_160[8];
  lub_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_160._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_148,local_150,lub_01);
  local_168.id = func.id;
  local_170.id = i31.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_180);
  lub_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_180._0_8_;
  lub_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_180[8];
  lub_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_180._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_168,local_170,lub_02);
  local_188.id = func.id;
  local_190.id = struct_.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1a0);
  lub_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1a0._0_8_;
  lub_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1a0[8];
  lub_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_188,local_190,lub_03);
  local_1a8.id = func.id;
  local_1b0.id = array.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1c0);
  lub_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1c0._0_8_;
  lub_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1c0[8];
  lub_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1a8,local_1b0,lub_04);
  local_1c8.id = func.id;
  local_1d0.id = string.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1e0);
  lub_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1e0._0_8_;
  lub_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1e0[8];
  lub_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1c8,local_1d0,lub_05);
  local_1e8.id = func.id;
  local_1f0.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_200);
  lub_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_200._0_8_;
  lub_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_200[8];
  lub_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_200._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1e8,local_1f0,lub_06);
  local_208.id = func.id;
  local_210.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_220);
  lub_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_220._0_8_;
  lub_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_220[8];
  lub_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_220._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_208,local_210,lub_07);
  local_228.id = func.id;
  local_230.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_240);
  lub_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_240._0_8_;
  lub_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_240[8];
  lub_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_240._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_228,local_230,lub_08);
  local_248.id = func.id;
  local_250.id = none.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_260);
  lub_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_260._0_8_;
  lub_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_260[8];
  lub_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_260._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_248,local_250,lub_09);
  local_268.id = func.id;
  local_270.id = noext.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_280);
  lub_10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_280._0_8_;
  lub_10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_280[8];
  lub_10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_280._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_268,local_270,lub_10);
  local_288.id = func.id;
  local_290.id = nofunc.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_2a0,&func);
  lub_11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_2a0._0_8_;
  lub_11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_2a0[8];
  lub_11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_2a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_288,local_290,lub_11);
  local_2a8.id = func.id;
  local_2b0.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_2c0);
  lub_12.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_12.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_2c0._0_8_;
  lub_12.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_2c0[8];
  lub_12.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_2c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_2a8,local_2b0,lub_12);
  local_2c8.id = func.id;
  local_2d0.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_2e0);
  lub_13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_2e0._0_8_;
  lub_13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_2e0[8];
  lub_13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_2e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_2c8,local_2d0,lub_13);
  local_2e8.id = func.id;
  local_2f0.id = local_a0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_300);
  lub_14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_300._0_8_;
  lub_14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_300[8];
  lub_14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_300._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_2e8,local_2f0,lub_14);
  local_308.id = func.id;
  local_310.id = local_d0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_320);
  lub_15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_320._0_8_;
  lub_15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_320[8];
  lub_15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_320._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_308,local_310,lub_15);
  local_328.id = any.id;
  local_330.id = any.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_340,&any);
  lub_16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_340._0_8_;
  lub_16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_340[8];
  lub_16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_340._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_328,local_330,lub_16);
  local_348.id = any.id;
  local_350.id = eq.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_360);
  lub_17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_360._0_8_;
  lub_17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_360[8];
  lub_17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_360._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_348,local_350,lub_17);
  local_368.id = any.id;
  local_370.id = i31.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_380);
  lub_18.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_18.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_380._0_8_;
  lub_18.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_380[8];
  lub_18.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_380._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_368,local_370,lub_18);
  local_388.id = any.id;
  local_390.id = struct_.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_3a0);
  lub_19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_3a0._0_8_;
  lub_19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_3a0[8];
  lub_19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_3a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_388,local_390,lub_19);
  local_3a8.id = any.id;
  local_3b0.id = array.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_3c0);
  lub_20.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_20.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_3c0._0_8_;
  lub_20.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_3c0[8];
  lub_20.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_3c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_3a8,local_3b0,lub_20);
  local_3c8.id = any.id;
  local_3d0.id = string.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_3e0);
  lub_21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_3e0._0_8_;
  lub_21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_3e0[8];
  lub_21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_3e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_3c8,local_3d0,lub_21);
  local_3e8.id = any.id;
  local_3f0.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_400);
  lub_22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_400._0_8_;
  lub_22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_400[8];
  lub_22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_400._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_3e8,local_3f0,lub_22);
  local_408.id = any.id;
  local_410.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_420);
  lub_23.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_23.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_420._0_8_;
  lub_23.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_420[8];
  lub_23.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_420._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_408,local_410,lub_23);
  local_428.id = any.id;
  local_430.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_440);
  lub_24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_440._0_8_;
  lub_24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_440[8];
  lub_24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_440._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_428,local_430,lub_24);
  local_448.id = any.id;
  local_450.id = none.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_460);
  lub_25.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_25.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_460._0_8_;
  lub_25.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_460[8];
  lub_25.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_460._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_448,local_450,lub_25);
  local_468.id = any.id;
  local_470.id = noext.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_480);
  lub_26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_480._0_8_;
  lub_26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_480[8];
  lub_26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_480._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_468,local_470,lub_26);
  local_488.id = any.id;
  local_490.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_4a0);
  lub_27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_4a0._0_8_;
  lub_27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_4a0[8];
  lub_27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_4a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_488,local_490,lub_27);
  local_4a8.id = any.id;
  local_4b0.id = defFunc.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_4c0,&any);
  lub_28.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_28.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_4c0._0_8_;
  lub_28.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_4c0[8];
  lub_28.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_4c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_4a8,local_4b0,lub_28);
  local_4c8.id = any.id;
  local_4d0.id = local_88.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_4e0,&any);
  lub_29.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_29.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_4e0._0_8_;
  lub_29.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_4e0[8];
  lub_29.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_4e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_4c8,local_4d0,lub_29);
  local_4e8.id = any.id;
  local_4f0.id = local_a0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_500);
  lub_30.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_30.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_500._0_8_;
  lub_30.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_500[8];
  lub_30.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_500._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_4e8,local_4f0,lub_30);
  local_508.id = any.id;
  local_510.id = local_d0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_520);
  lub_31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_520._0_8_;
  lub_31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_520[8];
  lub_31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_520._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_508,local_510,lub_31);
  local_528.id = eq.id;
  local_530.id = eq.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_540,&eq);
  lub_32.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_32.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_540._0_8_;
  lub_32.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_540[8];
  lub_32.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_540._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_528,local_530,lub_32);
  local_548.id = eq.id;
  local_550.id = i31.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_560,&eq);
  lub_33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_560._0_8_;
  lub_33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_560[8];
  lub_33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_560._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_548,local_550,lub_33);
  local_568.id = eq.id;
  local_570.id = struct_.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_580,&eq);
  lub_34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_580._0_8_;
  lub_34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_580[8];
  lub_34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_580._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_568,local_570,lub_34);
  local_588.id = eq.id;
  local_590.id = array.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_5a0,&eq);
  lub_35.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_35.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_5a0._0_8_;
  lub_35.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_5a0[8];
  lub_35.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_5a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_588,local_590,lub_35);
  local_5a8.id = eq.id;
  local_5b0.id = string.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_5c0,&eq);
  lub_36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_5c0._0_8_;
  lub_36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_5c0[8];
  lub_36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_5c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_5a8,local_5b0,lub_36);
  local_5c8.id = eq.id;
  local_5d0.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_5e0,&eq);
  lub_37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_5e0._0_8_;
  lub_37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_5e0[8];
  lub_37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_5e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_5c8,local_5d0,lub_37);
  local_5e8.id = eq.id;
  local_5f0.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_600,&eq);
  lub_38.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_38.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_600._0_8_;
  lub_38.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_600[8];
  lub_38.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_600._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_5e8,local_5f0,lub_38);
  local_608.id = eq.id;
  local_610.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_620,&eq);
  lub_39.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_39.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_620._0_8_;
  lub_39.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_620[8];
  lub_39.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_620._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_608,local_610,lub_39);
  local_628.id = eq.id;
  local_630.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_640,&eq);
  lub_40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_640._0_8_;
  lub_40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_640[8];
  lub_40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_640._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_628,local_630,lub_40);
  local_648.id = eq.id;
  local_650.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_660,&eq);
  lub_41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_660._0_8_;
  lub_41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_660[8];
  lub_41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_660._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_648,local_650,lub_41);
  local_668.id = eq.id;
  local_670.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_680);
  lub_42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_680._0_8_;
  lub_42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_680[8];
  lub_42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_680._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_668,local_670,lub_42);
  local_688.id = eq.id;
  local_690.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_6a0);
  lub_43.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_43.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_6a0._0_8_;
  lub_43.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_6a0[8];
  lub_43.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_6a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_688,local_690,lub_43);
  local_6a8.id = eq.id;
  local_6b0.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_6c0);
  lub_44.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_44.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_6c0._0_8_;
  lub_44.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_6c0[8];
  lub_44.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_6c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_6a8,local_6b0,lub_44);
  local_6c8.id = eq.id;
  local_6d0.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_6e0,&eq);
  lub_45.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_45.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_6e0._0_8_;
  lub_45.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_6e0[8];
  lub_45.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_6e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_6c8,local_6d0,lub_45);
  local_6e8.id = eq.id;
  local_6f0.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_700,&eq);
  lub_46.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_46.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_700._0_8_;
  lub_46.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_700[8];
  lub_46.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_700._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_6e8,local_6f0,lub_46);
  local_708.id = i31.id;
  local_710.id = i31.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_720,&i31);
  lub_47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_720._0_8_;
  lub_47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_720[8];
  lub_47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_720._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_708,local_710,lub_47);
  local_728.id = i31.id;
  local_730.id = struct_.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_740,&i31);
  lub_48.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_48.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_740._0_8_;
  lub_48.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_740[8];
  lub_48.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_740._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_728,local_730,lub_48);
  local_748.id = i31.id;
  local_750.id = array.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_760,&i31);
  lub_49.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_49.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_760._0_8_;
  lub_49.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_760[8];
  lub_49.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_760._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_748,local_750,lub_49);
  local_768.id = i31.id;
  local_770.id = string.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_780,&i31);
  lub_50.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_50.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_780._0_8_;
  lub_50.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_780[8];
  lub_50.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_780._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_768,local_770,lub_50);
  local_788.id = i31.id;
  local_790.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_7a0,&eq);
  lub_51.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_51.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_7a0._0_8_;
  lub_51.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_7a0[8];
  lub_51.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_7a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_788,local_790,lub_51);
  local_7a8.id = i31.id;
  local_7b0.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_7c0,&eq);
  lub_52.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_52.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_7c0._0_8_;
  lub_52.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_7c0[8];
  lub_52.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_7c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_7a8,local_7b0,lub_52);
  local_7c8.id = i31.id;
  local_7d0.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_7e0,&eq);
  lub_53.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_53.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_7e0._0_8_;
  lub_53.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_7e0[8];
  lub_53.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_7e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_7c8,local_7d0,lub_53);
  local_7e8.id = i31.id;
  local_7f0.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_800,&eq);
  lub_54.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_54.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_800._0_8_;
  lub_54.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_800[8];
  lub_54.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_800._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_7e8,local_7f0,lub_54);
  local_808.id = i31.id;
  local_810.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_820,&i31);
  lub_55.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_55.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_820._0_8_;
  lub_55.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_820[8];
  lub_55.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_820._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_808,local_810,lub_55);
  local_828.id = i31.id;
  local_830.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_840);
  lub_56.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_56.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_840._0_8_;
  lub_56.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_840[8];
  lub_56.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_840._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_828,local_830,lub_56);
  local_848.id = i31.id;
  local_850.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_860);
  lub_57.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_57.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_860._0_8_;
  lub_57.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_860[8];
  lub_57.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_860._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_848,local_850,lub_57);
  local_868.id = i31.id;
  local_870.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_880);
  lub_58.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_58.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_880._0_8_;
  lub_58.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_880[8];
  lub_58.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_880._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_868,local_870,lub_58);
  local_888.id = i31.id;
  local_890.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_8a0,&i31);
  lub_59.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_59.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_8a0._0_8_;
  lub_59.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_8a0[8];
  lub_59.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_8a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_888,local_890,lub_59);
  local_8a8.id = i31.id;
  local_8b0.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_8c0,&i31);
  lub_60.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_60.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_8c0._0_8_;
  lub_60.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_8c0[8];
  lub_60.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_8c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_8a8,local_8b0,lub_60);
  local_8c8.id = struct_.id;
  local_8d0.id = struct_.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_8e0,&struct_);
  lub_61.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_61.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_8e0._0_8_;
  lub_61.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_8e0[8];
  lub_61.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_8e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_8c8,local_8d0,lub_61);
  local_8e8.id = struct_.id;
  local_8f0.id = array.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_900,&i31);
  lub_62.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_62.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_900._0_8_;
  lub_62.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_900[8];
  lub_62.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_900._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_8e8,local_8f0,lub_62);
  local_908.id = struct_.id;
  local_910.id = string.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_920,&i31);
  lub_63.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_63.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_920._0_8_;
  lub_63.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_920[8];
  lub_63.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_920._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_908,local_910,lub_63);
  local_928.id = struct_.id;
  local_930.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_940,&eq);
  lub_64.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_64.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_940._0_8_;
  lub_64.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_940[8];
  lub_64.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_940._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_928,local_930,lub_64);
  local_948.id = struct_.id;
  local_950.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_960,&eq);
  lub_65.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_65.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_960._0_8_;
  lub_65.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_960[8];
  lub_65.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_960._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_948,local_950,lub_65);
  local_968.id = struct_.id;
  local_970.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_980,&eq);
  lub_66.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_66.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_980._0_8_;
  lub_66.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_980[8];
  lub_66.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_980._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_968,local_970,lub_66);
  local_988.id = struct_.id;
  local_990.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_9a0,&eq);
  lub_67.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_67.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_9a0._0_8_;
  lub_67.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_9a0[8];
  lub_67.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_9a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_988,local_990,lub_67);
  local_9a8.id = struct_.id;
  local_9b0.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_9c0,&struct_);
  lub_68.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_68.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_9c0._0_8_;
  lub_68.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_9c0[8];
  lub_68.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_9c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_9a8,local_9b0,lub_68);
  local_9c8.id = struct_.id;
  local_9d0.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_9e0);
  lub_69.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_69.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_9e0._0_8_;
  lub_69.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_9e0[8];
  lub_69.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_9e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_9c8,local_9d0,lub_69);
  local_9e8.id = struct_.id;
  local_9f0.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_a00);
  lub_70.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_70.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a00._0_8_;
  lub_70.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a00[8];
  lub_70.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a00._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_9e8,local_9f0,lub_70);
  local_a08.id = struct_.id;
  local_a10.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_a20);
  lub_71.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_71.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a20._0_8_;
  lub_71.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a20[8];
  lub_71.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a20._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_a08,local_a10,lub_71);
  local_a28.id = struct_.id;
  local_a30.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_a40,&i31);
  lub_72.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_72.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a40._0_8_;
  lub_72.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a40[8];
  lub_72.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a40._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_a28,local_a30,lub_72);
  local_a48.id = struct_.id;
  local_a50.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_a60,&i31);
  lub_73.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_73.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a60._0_8_;
  lub_73.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a60[8];
  lub_73.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a60._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_a48,local_a50,lub_73);
  local_a68.id = array.id;
  local_a70.id = array.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_a80,&array);
  lub_74.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_74.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a80._0_8_;
  lub_74.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a80[8];
  lub_74.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a80._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_a68,local_a70,lub_74);
  local_a88.id = array.id;
  local_a90.id = string.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_aa0,&i31);
  lub_75.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_75.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_aa0._0_8_;
  lub_75.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_aa0[8];
  lub_75.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_aa0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_a88,local_a90,lub_75);
  local_aa8.id = array.id;
  local_ab0.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_ac0,&eq);
  lub_76.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_76.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ac0._0_8_;
  lub_76.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ac0[8];
  lub_76.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ac0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_aa8,local_ab0,lub_76);
  local_ac8.id = array.id;
  local_ad0.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_ae0,&eq);
  lub_77.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_77.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ae0._0_8_;
  lub_77.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ae0[8];
  lub_77.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ae0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ac8,local_ad0,lub_77);
  local_ae8.id = array.id;
  local_af0.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_b00,&eq);
  lub_78.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_78.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b00._0_8_;
  lub_78.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b00[8];
  lub_78.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b00._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ae8,local_af0,lub_78);
  local_b08.id = array.id;
  local_b10.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_b20,&eq);
  lub_79.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_79.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b20._0_8_;
  lub_79.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b20[8];
  lub_79.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b20._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_b08,local_b10,lub_79);
  local_b28.id = array.id;
  local_b30.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_b40,&array);
  lub_80.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_80.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b40._0_8_;
  lub_80.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b40[8];
  lub_80.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b40._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_b28,local_b30,lub_80);
  local_b48.id = array.id;
  local_b50.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_b60);
  lub_81.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_81.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b60._0_8_;
  lub_81.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b60[8];
  lub_81.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b60._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_b48,local_b50,lub_81);
  local_b68.id = array.id;
  local_b70.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_b80);
  lub_82.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_82.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b80._0_8_;
  lub_82.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b80[8];
  lub_82.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b80._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_b68,local_b70,lub_82);
  local_b88.id = array.id;
  local_b90.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_ba0);
  lub_83.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_83.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ba0._0_8_;
  lub_83.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ba0[8];
  lub_83.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ba0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_b88,local_b90,lub_83);
  local_ba8.id = array.id;
  local_bb0.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_bc0,&array);
  lub_84.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_84.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_bc0._0_8_;
  lub_84.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_bc0[8];
  lub_84.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_bc0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ba8,local_bb0,lub_84);
  local_bc8.id = array.id;
  local_bd0.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_be0,&i31);
  lub_85.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_85.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_be0._0_8_;
  lub_85.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_be0[8];
  lub_85.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_be0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_bc8,local_bd0,lub_85);
  local_be8.id = string.id;
  local_bf0.id = string.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_c00,&string);
  lub_86.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_86.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_c00._0_8_;
  lub_86.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_c00[8];
  lub_86.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_c00._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_be8,local_bf0,lub_86);
  local_c08.id = string.id;
  local_c10.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_c20,&eq);
  lub_87.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_87.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_c20._0_8_;
  lub_87.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_c20[8];
  lub_87.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_c20._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_c08,local_c10,lub_87);
  local_c28.id = string.id;
  local_c30.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_c40,&eq);
  lub_88.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_88.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_c40._0_8_;
  lub_88.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_c40[8];
  lub_88.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_c40._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_c28,local_c30,lub_88);
  local_c48.id = string.id;
  local_c50.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_c60,&eq);
  lub_89.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_89.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_c60._0_8_;
  lub_89.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_c60[8];
  lub_89.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_c60._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_c48,local_c50,lub_89);
  local_c68.id = string.id;
  local_c70.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_c80,&eq);
  lub_90.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_90.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_c80._0_8_;
  lub_90.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_c80[8];
  lub_90.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_c80._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_c68,local_c70,lub_90);
  local_c88.id = string.id;
  local_c90.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_ca0,&string);
  lub_91.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_91.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ca0._0_8_;
  lub_91.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ca0[8];
  lub_91.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ca0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_c88,local_c90,lub_91);
  local_ca8.id = string.id;
  local_cb0.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_cc0);
  lub_92.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_92.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_cc0._0_8_;
  lub_92.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_cc0[8];
  lub_92.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_cc0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ca8,local_cb0,lub_92);
  local_cc8.id = string.id;
  local_cd0.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_ce0);
  lub_93.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_93.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ce0._0_8_;
  lub_93.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ce0[8];
  lub_93.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ce0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_cc8,local_cd0,lub_93);
  local_ce8.id = string.id;
  local_cf0.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_d00);
  lub_94.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_94.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d00._0_8_;
  lub_94.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d00[8];
  lub_94.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d00._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ce8,local_cf0,lub_94);
  local_d08.id = string.id;
  local_d10.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_d20,&i31);
  lub_95.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_95.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d20._0_8_;
  lub_95.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d20[8];
  lub_95.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d20._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_d08,local_d10,lub_95);
  local_d28.id = string.id;
  local_d30.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_d40,&string);
  lub_96.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_96.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d40._0_8_;
  lub_96.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d40[8];
  lub_96.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d40._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_d28,local_d30,lub_96);
  local_d48.id = stringview_wtf8.id;
  local_d50.id = stringview_wtf8.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_d60,&stringview_wtf8);
  lub_97.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_97.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d60._0_8_;
  lub_97.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d60[8];
  lub_97.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d60._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_d48,local_d50,lub_97);
  local_d68.id = stringview_wtf8.id;
  local_d70.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_d80,&eq);
  lub_98.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_98.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d80._0_8_;
  lub_98.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d80[8];
  lub_98.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d80._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_d68,local_d70,lub_98);
  local_d88.id = stringview_wtf8.id;
  local_d90.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_da0,&eq);
  lub_99.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_99.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_da0._0_8_;
  lub_99.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_da0[8];
  lub_99.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_da0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_d88,local_d90,lub_99);
  local_da8.id = stringview_wtf8.id;
  local_db0.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_dc0,&eq);
  lub_x00100.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00100.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_dc0._0_8_;
  lub_x00100.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_dc0[8];
  lub_x00100.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_dc0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_da8,local_db0,lub_x00100);
  local_dc8.id = stringview_wtf8.id;
  local_dd0.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_de0,&stringview_wtf8);
  lub_x00101.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00101.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_de0._0_8_;
  lub_x00101.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_de0[8];
  lub_x00101.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_de0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_dc8,local_dd0,lub_x00101);
  local_de8.id = stringview_wtf8.id;
  local_df0.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_e00);
  lub_x00102.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00102.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_e00._0_8_;
  lub_x00102.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_e00[8];
  lub_x00102.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_e00._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_de8,local_df0,lub_x00102);
  local_e08.id = stringview_wtf8.id;
  local_e10.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_e20);
  lub_x00103.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00103.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_e20._0_8_;
  lub_x00103.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_e20[8];
  lub_x00103.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_e20._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_e08,local_e10,lub_x00103);
  local_e28.id = stringview_wtf8.id;
  local_e30.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_e40);
  lub_x00104.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00104.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_e40._0_8_;
  lub_x00104.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_e40[8];
  lub_x00104.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_e40._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_e28,local_e30,lub_x00104);
  local_e48.id = stringview_wtf8.id;
  local_e50.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_e60,&eq);
  lub_x00105.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00105.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_e60._0_8_;
  lub_x00105.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_e60[8];
  lub_x00105.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_e60._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_e48,local_e50,lub_x00105);
  local_e68.id = stringview_wtf8.id;
  local_e70.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_e80,&eq);
  lub_x00106.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00106.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_e80._0_8_;
  lub_x00106.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_e80[8];
  lub_x00106.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_e80._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_e68,local_e70,lub_x00106);
  local_e88.id = stringview_wtf16.id;
  local_e90.id = stringview_wtf16.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_ea0,&stringview_wtf16);
  lub_x00107.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00107.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ea0._0_8_;
  lub_x00107.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ea0[8];
  lub_x00107.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ea0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_e88,local_e90,lub_x00107);
  local_ea8.id = stringview_wtf16.id;
  local_eb0.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_ec0,&eq);
  lub_x00108.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00108.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ec0._0_8_;
  lub_x00108.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ec0[8];
  lub_x00108.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ec0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ea8,local_eb0,lub_x00108);
  local_ec8.id = stringview_wtf16.id;
  local_ed0.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_ee0,&eq);
  lub_x00109.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00109.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_ee0._0_8_;
  lub_x00109.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_ee0[8];
  lub_x00109.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_ee0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ec8,local_ed0,lub_x00109);
  local_ee8.id = stringview_wtf16.id;
  local_ef0.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_f00,&stringview_wtf16);
  lub_x00110.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00110.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_f00._0_8_;
  lub_x00110.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_f00[8];
  lub_x00110.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_f00._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_ee8,local_ef0,lub_x00110);
  local_f08.id = stringview_wtf16.id;
  local_f10.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_f20);
  lub_x00111.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00111.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_f20._0_8_;
  lub_x00111.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_f20[8];
  lub_x00111.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_f20._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_f08,local_f10,lub_x00111);
  local_f28.id = stringview_wtf16.id;
  local_f30.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_f40);
  lub_x00112.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00112.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_f40._0_8_;
  lub_x00112.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_f40[8];
  lub_x00112.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_f40._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_f28,local_f30,lub_x00112);
  local_f48.id = stringview_wtf16.id;
  local_f50.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_f60);
  lub_x00113.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00113.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_f60._0_8_;
  lub_x00113.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_f60[8];
  lub_x00113.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_f60._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_f48,local_f50,lub_x00113);
  local_f68.id = stringview_wtf16.id;
  local_f70.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_f80,&eq);
  lub_x00114.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00114.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_f80._0_8_;
  lub_x00114.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_f80[8];
  lub_x00114.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_f80._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_f68,local_f70,lub_x00114);
  local_f88.id = stringview_wtf16.id;
  local_f90.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_fa0,&eq);
  lub_x00115.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00115.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_fa0._0_8_;
  lub_x00115.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_fa0[8];
  lub_x00115.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_fa0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_f88,local_f90,lub_x00115);
  local_fa8.id = stringview_iter.id;
  local_fb0.id = stringview_iter.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_fc0,&stringview_iter);
  lub_x00116.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00116.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_fc0._0_8_;
  lub_x00116.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_fc0[8];
  lub_x00116.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_fc0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_fa8,local_fb0,lub_x00116);
  local_fc8.id = stringview_iter.id;
  local_fd0.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_fe0,&eq);
  lub_x00117.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00117.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_fe0._0_8_;
  lub_x00117.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_fe0[8];
  lub_x00117.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_fe0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_fc8,local_fd0,lub_x00117);
  local_fe8.id = stringview_iter.id;
  local_ff0.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1000,&stringview_iter);
  lub_x00118.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00118.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1000._0_8_;
  lub_x00118.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1000[8];
  lub_x00118.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1000._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_fe8,local_ff0,lub_x00118);
  local_1008.id = stringview_iter.id;
  local_1010.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1020);
  lub_x00119.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00119.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1020._0_8_;
  lub_x00119.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1020[8];
  lub_x00119.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1020._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1008,local_1010,lub_x00119);
  local_1028.id = stringview_iter.id;
  local_1030.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1040);
  lub_x00120.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00120.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1040._0_8_;
  lub_x00120.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1040[8];
  lub_x00120.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1040._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1028,local_1030,lub_x00120);
  local_1048.id = stringview_iter.id;
  local_1050.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1060);
  lub_x00121.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00121.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1060._0_8_;
  lub_x00121.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1060[8];
  lub_x00121.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1060._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1048,local_1050,lub_x00121);
  local_1068.id = stringview_iter.id;
  local_1070.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1080,&eq);
  lub_x00122.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00122.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1080._0_8_;
  lub_x00122.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1080[8];
  lub_x00122.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1080._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1068,local_1070,lub_x00122);
  local_1088.id = stringview_iter.id;
  local_1090.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_10a0,&eq);
  lub_x00123.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00123.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_10a0._0_8_;
  lub_x00123.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_10a0[8];
  lub_x00123.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_10a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1088,local_1090,lub_x00123);
  local_10a8.id = none.id;
  local_10b0.id = none.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_10c0,&none);
  lub_x00124.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00124.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_10c0._0_8_;
  lub_x00124.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_10c0[8];
  lub_x00124.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_10c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_10a8,local_10b0,lub_x00124);
  local_10c8.id = none.id;
  local_10d0.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_10e0,&none);
  lub_x00125.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00125.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_10e0._0_8_;
  lub_x00125.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_10e0[8];
  lub_x00125.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_10e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_10c8,local_10d0,lub_x00125);
  local_10e8.id = none.id;
  local_10f0.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1100);
  lub_x00126.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00126.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1100._0_8_;
  lub_x00126.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1100[8];
  lub_x00126.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1100._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_10e8,local_10f0,lub_x00126);
  local_1108.id = none.id;
  local_1110.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1120);
  lub_x00127.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00127.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1120._0_8_;
  lub_x00127.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1120[8];
  lub_x00127.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1120._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1108,local_1110,lub_x00127);
  local_1128.id = none.id;
  local_1130.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1140);
  lub_x00128.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00128.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1140._0_8_;
  lub_x00128.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1140[8];
  lub_x00128.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1140._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1128,local_1130,lub_x00128);
  local_1148.id = none.id;
  local_1150.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1160,&eq);
  lub_x00129.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00129.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1160._0_8_;
  lub_x00129.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1160[8];
  lub_x00129.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1160._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1148,local_1150,lub_x00129);
  local_1168.id = none.id;
  local_1170.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1180,&eq);
  lub_x00130.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00130.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1180._0_8_;
  lub_x00130.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1180[8];
  lub_x00130.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1180._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1168,local_1170,lub_x00130);
  local_1188.id = noext.id;
  local_1190.id = noext.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_11a0,&noext);
  lub_x00131.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00131.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_11a0._0_8_;
  lub_x00131.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_11a0[8];
  lub_x00131.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_11a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1188,local_1190,lub_x00131);
  local_11a8.id = noext.id;
  local_11b0.id = nofunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_11c0);
  lub_x00132.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00132.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_11c0._0_8_;
  lub_x00132.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_11c0[8];
  lub_x00132.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_11c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_11a8,local_11b0,lub_x00132);
  local_11c8.id = noext.id;
  local_11d0.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_11e0);
  lub_x00133.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00133.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_11e0._0_8_;
  lub_x00133.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_11e0[8];
  lub_x00133.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_11e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_11c8,local_11d0,lub_x00133);
  local_11e8.id = noext.id;
  local_11f0.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1200);
  lub_x00134.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00134.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1200._0_8_;
  lub_x00134.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1200[8];
  lub_x00134.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1200._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_11e8,local_11f0,lub_x00134);
  local_1208.id = noext.id;
  local_1210.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1220,&local_a0);
  lub_x00135.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00135.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1220._0_8_;
  lub_x00135.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1220[8];
  lub_x00135.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1220._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1208,local_1210,lub_x00135);
  local_1228.id = noext.id;
  local_1230.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1240,&local_d0);
  lub_x00136.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00136.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1240._0_8_;
  lub_x00136.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1240[8];
  lub_x00136.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1240._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1228,local_1230,lub_x00136);
  local_1248.id = nofunc.id;
  local_1250.id = nofunc.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1260,&nofunc);
  lub_x00137.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00137.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1260._0_8_;
  lub_x00137.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1260[8];
  lub_x00137.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1260._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1248,local_1250,lub_x00137);
  local_1268.id = nofunc.id;
  local_1270.id = defFunc.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1280);
  lub_x00138.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00138.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1280._0_8_;
  lub_x00138.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1280[8];
  lub_x00138.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1280._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1268,local_1270,lub_x00138);
  local_1288.id = nofunc.id;
  local_1290.id = local_88.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_12a0);
  lub_x00139.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00139.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_12a0._0_8_;
  lub_x00139.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_12a0[8];
  lub_x00139.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_12a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1288,local_1290,lub_x00139);
  local_12a8.id = nofunc.id;
  local_12b0.id = local_a0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_12c0);
  lub_x00140.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00140.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_12c0._0_8_;
  lub_x00140.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_12c0[8];
  lub_x00140.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_12c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_12a8,local_12b0,lub_x00140);
  local_12c8.id = nofunc.id;
  local_12d0.id = local_d0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_12e0);
  lub_x00141.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00141.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_12e0._0_8_;
  lub_x00141.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_12e0[8];
  lub_x00141.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_12e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_12c8,local_12d0,lub_x00141);
  local_12e8.id = defFunc.id;
  local_12f0.id = defFunc.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1300,&defFunc);
  lub_x00142.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00142.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1300._0_8_;
  lub_x00142.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1300[8];
  lub_x00142.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1300._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_12e8,local_12f0,lub_x00142);
  local_1308.id = defFunc.id;
  local_1310.id = local_88.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1320,&local_88);
  lub_x00143.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00143.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1320._0_8_;
  lub_x00143.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1320[8];
  lub_x00143.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1320._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1308,local_1310,lub_x00143);
  local_1328.id = defFunc.id;
  local_1330.id = local_a0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1340);
  lub_x00144.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00144.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1340._0_8_;
  lub_x00144.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1340[8];
  lub_x00144.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1340._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1328,local_1330,lub_x00144);
  local_1348.id = defFunc.id;
  local_1350.id = local_d0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_1360);
  lub_x00145.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00145.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1360._0_8_;
  lub_x00145.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1360[8];
  lub_x00145.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1360._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1348,local_1350,lub_x00145);
  local_1368.id = local_88.id;
  local_1370.id = local_88.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1380,&local_88);
  lub_x00146.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00146.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1380._0_8_;
  lub_x00146.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1380[8];
  lub_x00146.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1380._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1368,local_1370,lub_x00146);
  local_1388.id = local_88.id;
  local_1390.id = local_a0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_13a0);
  lub_x00147.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00147.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_13a0._0_8_;
  lub_x00147.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_13a0[8];
  lub_x00147.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_13a0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_1388,local_1390,lub_x00147);
  local_13a8.id = local_88.id;
  local_13b0.id = local_d0.id;
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_13c0);
  lub_x00148.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00148.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_13c0._0_8_;
  lub_x00148.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_13c0[8];
  lub_x00148.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_13c0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_13a8,local_13b0,lub_x00148);
  local_13c8.id = local_a0.id;
  local_13d0.id = local_a0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_13e0,&local_a0);
  lub_x00149.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00149.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_13e0._0_8_;
  lub_x00149.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_13e0[8];
  lub_x00149.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_13e0._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_13c8,local_13d0,lub_x00149);
  local_13e8.id = local_a0.id;
  local_13f0.id = local_d0.id;
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_1400,&i31);
  lub_x00150.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00150.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1400._0_8_;
  lub_x00150.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1400[8];
  lub_x00150.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1400._9_3_;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_13e8,local_13f0,lub_x00150);
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)&anyref,&local_d0);
  lub_x00151.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  lub_x00151.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)anyref.id;
  lub_x00151.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1418;
  lub_x00151.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_1417;
  TestBody::anon_class_1_0_00000001::operator()(&local_f9,local_d0,local_d0,lub_x00151);
  eqref.id = eq.id;
  wasm::Type::Type(&local_1428,eq,Nullable);
  nonNullable.id = i31.id;
  wasm::Type::Type(&local_1438,i31,Nullable);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )eq.id;
  wasm::Type::Type(&local_1448,eq,NonNullable);
  local_1470 = local_1448.id;
  local_1478 = local_1428.id;
  local_1461 = (bool)wasm::Type::isSubType(local_1448,local_1428);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1460,&local_1461,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1460);
  if (!bVar1) {
    testing::Message::Message(&local_1480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1460,
               (AssertionResult *)"Type::isSubType(nonNullable, anyref)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1488,&local_1480);
    testing::internal::AssertHelper::~AssertHelper(&local_1488);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1460);
  local_14c8 = local_1428.id;
  local_14d0 = local_1448.id;
  local_14b9 = (bool)wasm::Type::isSubType(local_1428,local_1448);
  local_14b9 = (bool)(local_14b9 ^ 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_14b8,&local_14b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b8);
  if (!bVar1) {
    testing::Message::Message(&local_14d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_14b8,
               (AssertionResult *)"Type::isSubType(anyref, nonNullable)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_14e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_14e0,&local_14d8);
    testing::internal::AssertHelper::~AssertHelper(&local_14e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_14d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b8);
  local_1520 = local_1428.id;
  local_1528 = local_1448.id;
  local_1511 = (bool)wasm::Type::hasLeastUpperBound(local_1428,local_1448);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1510,&local_1511,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1510);
  if (!bVar1) {
    testing::Message::Message(&local_1530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1510,
               (AssertionResult *)"Type::hasLeastUpperBound(anyref, nonNullable)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1538,&local_1530);
    testing::internal::AssertHelper::~AssertHelper(&local_1538);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1510);
  local_1578 = local_1428.id;
  local_1580 = local_1448.id;
  local_1570.id = wasm::Type::getLeastUpperBound(local_1428,local_1448);
  testing::internal::EqHelper::Compare<wasm::Type,_wasm::Type,_nullptr>
            ((EqHelper *)local_1568,"Type::getLeastUpperBound(anyref, nonNullable)","anyref",
             &local_1570,&local_1428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1568);
  if (!bVar1) {
    testing::Message::Message(&local_1588);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&builder,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&builder,&local_1588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
    testing::Message::~Message(&local_1588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1568);
  wasm::TypeBuilder::TypeBuilder(&local_1598,2);
  local_15c0 = local_1428.id;
  wasm::Field::Field(&local_15b8,local_1428,Immutable);
  wasm::Array::Array(&local_15a8,local_15b8);
  local_15d0 = wasm::TypeBuilder::operator[](&local_1598,0);
  wasm::TypeBuilder::Entry::operator=(&local_15d0,&local_15a8);
  local_15f8 = local_1438.id;
  wasm::Field::Field(&local_15f0,local_1438,Immutable);
  wasm::Array::Array(&local_15e0,local_15f0);
  local_1608 = wasm::TypeBuilder::operator[](&local_1598,1);
  wasm::TypeBuilder::Entry::operator=(&local_1608,&local_15e0);
  local_1618 = wasm::TypeBuilder::operator[](&local_1598,1);
  EVar8 = wasm::TypeBuilder::operator[](&local_1598,0);
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar8.builder;
  HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                    ((Entry *)((long)&results.
                                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              + 0x18));
  wasm::TypeBuilder::Entry::subTypeOf(&local_1618,HVar4);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_1660,(BuildResult *)&gtest_ar__3.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1660);
  if (!bVar1) {
    testing::Message::Message(&local_1668);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1690,(internal *)local_1660,(AssertionResult *)"results","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1670,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x303,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1670,&local_1668);
    testing::internal::AssertHelper::~AssertHelper(&local_1670);
    std::__cxx11::string::~string((string *)&local_1690);
    testing::Message::~Message(&local_1668);
  }
  bVar1 = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1660);
  if (!bVar1) {
    pvVar5 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__3.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar__4.message_,
               pvVar5);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar__4.message_,1);
    local_16d0.id = pvVar6->id;
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar__4.message_,0);
    local_16d8 = pvVar6->id;
    bVar2 = wasm::HeapType::isSubType(local_16d0,(HeapType)local_16d8);
    local_16c1 = (bool)(bVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_16c0,&local_16c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16c0);
    if (!bVar1) {
      testing::Message::Message(&local_16e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&builder_1,(internal *)local_16c0,
                 (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_16e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x305,pcVar3);
      testing::internal::AssertHelper::operator=(&local_16e8,&local_16e0);
      testing::internal::AssertHelper::~AssertHelper(&local_16e8);
      std::__cxx11::string::~string((string *)&builder_1);
      testing::Message::~Message(&local_16e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_16c0);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar__4.message_);
    bVar1 = false;
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__3.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_1598);
  if (!bVar1) {
    wasm::TypeBuilder::TypeBuilder(&local_1710,2);
    local_1768 = local_1428.id;
    wasm::Field::Field(&local_1760,local_1428,Immutable);
    local_1750 = &local_1760;
    local_1748 = 1;
    std::allocator<wasm::Field>::allocator(&local_1769);
    __l_08._M_len = local_1748;
    __l_08._M_array = local_1750;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_1740,__l_08,&local_1769);
    wasm::Struct::Struct(&local_1728,&local_1740);
    local_1780 = wasm::TypeBuilder::operator[](&local_1710,0);
    wasm::TypeBuilder::Entry::operator=(&local_1780,&local_1728);
    wasm::Struct::~Struct(&local_1728);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1740);
    std::allocator<wasm::Field>::~allocator(&local_1769);
    local_17d8 = local_1438.id;
    wasm::Field::Field(&local_17d0,local_1438,Immutable);
    local_17c0 = &local_17d0;
    local_17b8 = 1;
    std::allocator<wasm::Field>::allocator(&local_17d9);
    __l_07._M_len = local_17b8;
    __l_07._M_array = local_17c0;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_17b0,__l_07,&local_17d9);
    wasm::Struct::Struct(&local_1798,&local_17b0);
    local_17f0 = wasm::TypeBuilder::operator[](&local_1710,1);
    wasm::TypeBuilder::Entry::operator=(&local_17f0,&local_1798);
    wasm::Struct::~Struct(&local_1798);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_17b0);
    std::allocator<wasm::Field>::~allocator(&local_17d9);
    local_1800 = wasm::TypeBuilder::operator[](&local_1710,1);
    EVar8 = wasm::TypeBuilder::operator[](&local_1710,0);
    results_1.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         EVar8.builder;
    HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                      ((Entry *)((long)&results_1.
                                        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                + 0x18));
    wasm::TypeBuilder::Entry::subTypeOf(&local_1800,HVar4);
    wasm::TypeBuilder::build();
    testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
              ((AssertionResult *)local_1848,(BuildResult *)&gtest_ar__5.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1848);
    if (!bVar1) {
      testing::Message::Message(&local_1850);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &built_1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1848,
                 (AssertionResult *)"results","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1858,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x30f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1858,&local_1850);
      testing::internal::AssertHelper::~AssertHelper(&local_1858);
      std::__cxx11::string::~string
                ((string *)
                 &built_1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_1850);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1848);
    if (!bVar1) {
      pvVar5 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__5.message_);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar__6.message_,
                 pvVar5);
      pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar__6.message_,1);
      local_18b0.id = pvVar6->id;
      pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar__6.message_,0);
      local_18b8 = pvVar6->id;
      bVar2 = wasm::HeapType::isSubType(local_18b0,(HeapType)local_18b8);
      local_18a1 = (bool)(bVar2 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_18a0,&local_18a1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18a0);
      if (!bVar1) {
        testing::Message::Message(&local_18c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&builder_2,(internal *)local_18a0,
                   (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",in_R9
                  );
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_18c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x311,pcVar3);
        testing::internal::AssertHelper::operator=(&local_18c8,&local_18c0);
        testing::internal::AssertHelper::~AssertHelper(&local_18c8);
        std::__cxx11::string::~string((string *)&builder_2);
        testing::Message::~Message(&local_18c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_18a0);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar__6.message_);
      bVar1 = false;
    }
    wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__5.message_);
    wasm::TypeBuilder::~TypeBuilder(&local_1710);
    if (!bVar1) {
      wasm::TypeBuilder::TypeBuilder(&local_18f0,2);
      local_1948 = local_1428.id;
      wasm::Field::Field(&local_1940,local_1428,Immutable);
      local_1930 = &local_1940;
      local_1928 = 1;
      std::allocator<wasm::Field>::allocator(&local_1949);
      __l_06._M_len = local_1928;
      __l_06._M_array = local_1930;
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_1920,__l_06,&local_1949)
      ;
      wasm::Struct::Struct(&local_1908,&local_1920);
      local_1960 = wasm::TypeBuilder::operator[](&local_18f0,0);
      wasm::TypeBuilder::Entry::operator=(&local_1960,&local_1908);
      wasm::Struct::~Struct(&local_1908);
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1920);
      std::allocator<wasm::Field>::~allocator(&local_1949);
      local_19c8 = local_1428.id;
      wasm::Field::Field(&local_19c0,local_1428,Immutable);
      local_19d0 = local_1428.id;
      wasm::Field::Field(&local_19b0,local_1428,Immutable);
      local_19a0 = &local_19c0;
      local_1998 = 2;
      std::allocator<wasm::Field>::allocator(&local_19d1);
      __l_05._M_len = local_1998;
      __l_05._M_array = local_19a0;
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_1990,__l_05,&local_19d1)
      ;
      wasm::Struct::Struct(&local_1978,&local_1990);
      local_19e8 = wasm::TypeBuilder::operator[](&local_18f0,1);
      wasm::TypeBuilder::Entry::operator=(&local_19e8,&local_1978);
      wasm::Struct::~Struct(&local_1978);
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1990);
      std::allocator<wasm::Field>::~allocator(&local_19d1);
      local_19f8 = wasm::TypeBuilder::operator[](&local_18f0,1);
      EVar8 = wasm::TypeBuilder::operator[](&local_18f0,0);
      results_2.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
           EVar8.builder;
      HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                        ((Entry *)((long)&results_2.
                                          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                          .
                                          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                          .
                                          super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                          .
                                          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                          .
                                          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                          .
                                          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  + 0x18));
      wasm::TypeBuilder::Entry::subTypeOf(&local_19f8,HVar4);
      wasm::TypeBuilder::build();
      testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                ((AssertionResult *)local_1a40,(BuildResult *)&gtest_ar__7.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a40);
      if (!bVar1) {
        testing::Message::Message(&local_1a48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &built_2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1a40,
                   (AssertionResult *)"results","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x31b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a50,&local_1a48);
        testing::internal::AssertHelper::~AssertHelper(&local_1a50);
        std::__cxx11::string::~string
                  ((string *)
                   &built_2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_1a48);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a40);
      if (!bVar1) {
        pvVar5 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__7.message_);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar__8.message_,
                   pvVar5);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar__8.message_,1);
        local_1aa8.id = pvVar6->id;
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar__8.message_,0);
        local_1ab0 = pvVar6->id;
        bVar2 = wasm::HeapType::isSubType(local_1aa8,(HeapType)local_1ab0);
        local_1a99 = (bool)(bVar2 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1a98,&local_1a99,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a98);
        if (!bVar1) {
          testing::Message::Message(&local_1ab8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&builder_3,(internal *)local_1a98,
                     (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1ac0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x31d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1ac0,&local_1ab8);
          testing::internal::AssertHelper::~AssertHelper(&local_1ac0);
          std::__cxx11::string::~string((string *)&builder_3);
          testing::Message::~Message(&local_1ab8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a98);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar__8.message_)
        ;
        bVar1 = false;
      }
      wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__7.message_);
      wasm::TypeBuilder::~TypeBuilder(&local_18f0);
      if (!bVar1) {
        wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&ref0,4);
        EVar8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,0);
        ref1.id = (uintptr_t)EVar8.builder;
        HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&ref1);
        TVar7.id = wasm::TypeBuilder::getTempRefType((HeapType)&ref0,(Nullability)HVar4.id);
        local_1b28 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,1);
        local_1b18 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_1b28);
        local_1b10.id = wasm::TypeBuilder::getTempRefType((HeapType)&ref0,(Nullability)local_1b18);
        local_1b80 = local_1428.id;
        wasm::Field::Field(&local_1b78,local_1428,Immutable);
        local_1b68 = &local_1b78;
        local_1b60 = 1;
        std::allocator<wasm::Field>::allocator(&local_1b81);
        __l_04._M_len = local_1b60;
        __l_04._M_array = local_1b68;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  (&local_1b58,__l_04,&local_1b81);
        wasm::Struct::Struct(&local_1b40,&local_1b58);
        local_1b98 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,0);
        wasm::TypeBuilder::Entry::operator=(&local_1b98,&local_1b40);
        wasm::Struct::~Struct(&local_1b40);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1b58);
        std::allocator<wasm::Field>::~allocator(&local_1b81);
        local_1bf0 = local_1438.id;
        wasm::Field::Field(&local_1be8,local_1438,Immutable);
        local_1bd8 = &local_1be8;
        local_1bd0 = 1;
        std::allocator<wasm::Field>::allocator(&local_1bf1);
        __l_03._M_len = local_1bd0;
        __l_03._M_array = local_1bd8;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  (&local_1bc8,__l_03,&local_1bf1);
        wasm::Struct::Struct(&local_1bb0,&local_1bc8);
        local_1c08 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,1);
        wasm::TypeBuilder::Entry::operator=(&local_1c08,&local_1bb0);
        wasm::Struct::~Struct(&local_1bb0);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1bc8);
        std::allocator<wasm::Field>::~allocator(&local_1bf1);
        local_1c60 = TVar7.id;
        wasm::Field::Field(&local_1c58,TVar7,Immutable);
        local_1c48 = &local_1c58;
        local_1c40 = 1;
        std::allocator<wasm::Field>::allocator(&local_1c61);
        __l_02._M_len = local_1c40;
        __l_02._M_array = local_1c48;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  (&local_1c38,__l_02,&local_1c61);
        wasm::Struct::Struct(&local_1c20,&local_1c38);
        local_1c78 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,2);
        wasm::TypeBuilder::Entry::operator=(&local_1c78,&local_1c20);
        wasm::Struct::~Struct(&local_1c20);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1c38);
        std::allocator<wasm::Field>::~allocator(&local_1c61);
        local_1cd0 = local_1b10.id;
        wasm::Field::Field(&local_1cc8,local_1b10,Immutable);
        local_1cb8 = &local_1cc8;
        local_1cb0 = 1;
        std::allocator<wasm::Field>::allocator(&local_1cd1);
        __l_01._M_len = local_1cb0;
        __l_01._M_array = local_1cb8;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  (&local_1ca8,__l_01,&local_1cd1);
        wasm::Struct::Struct(&local_1c90,&local_1ca8);
        local_1ce8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,3);
        wasm::TypeBuilder::Entry::operator=(&local_1ce8,&local_1c90);
        wasm::Struct::~Struct(&local_1c90);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1ca8);
        std::allocator<wasm::Field>::~allocator(&local_1cd1);
        local_1cf8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,1);
        local_1d10 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,0);
        local_1d00 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_1d10);
        wasm::TypeBuilder::Entry::subTypeOf(&local_1cf8,(HeapType)local_1d00);
        local_1d20 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,3);
        EVar8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0,2);
        results_3.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
             EVar8.builder;
        HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                          ((Entry *)((long)&results_3.
                                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                            .
                                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                            .
                                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                            .
                                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                            .
                                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                            .
                                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    + 0x18));
        wasm::TypeBuilder::Entry::subTypeOf(&local_1d20,HVar4);
        wasm::TypeBuilder::build();
        testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                  ((AssertionResult *)local_1d68,(BuildResult *)&gtest_ar__9.message_,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d68);
        if (!bVar1) {
          testing::Message::Message(&local_1d70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &built_3.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1d68,
                     (AssertionResult *)"results","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x32c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1d78,&local_1d70);
          testing::internal::AssertHelper::~AssertHelper(&local_1d78);
          std::__cxx11::string::~string
                    ((string *)
                     &built_3.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_1d70);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d68);
        if (!bVar1) {
          pvVar5 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__9.message_);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &gtest_ar__10.message_,pvVar5);
          pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &gtest_ar__10.message_,3);
          local_1dd0.id = pvVar6->id;
          pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &gtest_ar__10.message_,2);
          local_1dd8 = pvVar6->id;
          bVar2 = wasm::HeapType::isSubType(local_1dd0,(HeapType)local_1dd8);
          local_1dc1 = (bool)(bVar2 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1dc0,&local_1dc1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dc0);
          if (!bVar1) {
            testing::Message::Message(&local_1de0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&builder_4,(internal *)local_1dc0,
                       (AssertionResult *)"HeapType::isSubType(built[3], built[2])","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1de8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x32e,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1de8,&local_1de0);
            testing::internal::AssertHelper::~AssertHelper(&local_1de8);
            std::__cxx11::string::~string((string *)&builder_4);
            testing::Message::~Message(&local_1de0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dc0);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &gtest_ar__10.message_);
          bVar1 = false;
        }
        wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__9.message_);
        wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&ref0);
        if (!bVar1) {
          wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&ref0_1,2);
          EVar8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0_1,0);
          ref1_1.id = (uintptr_t)EVar8.builder;
          HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&ref1_1);
          TVar7.id = wasm::TypeBuilder::getTempRefType((HeapType)&ref0_1,(Nullability)HVar4.id);
          local_1e50 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0_1,1);
          local_1e40 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_1e50);
          local_1e38.id =
               wasm::TypeBuilder::getTempRefType((HeapType)&ref0_1,(Nullability)local_1e40);
          local_1ea8 = TVar7.id;
          wasm::Field::Field(&local_1ea0,TVar7,Immutable);
          local_1e90 = &local_1ea0;
          local_1e88 = 1;
          std::allocator<wasm::Field>::allocator(&local_1ea9);
          __l_00._M_len = local_1e88;
          __l_00._M_array = local_1e90;
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    (&local_1e80,__l_00,&local_1ea9);
          wasm::Struct::Struct(&local_1e68,&local_1e80);
          local_1ec0 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0_1,0);
          wasm::TypeBuilder::Entry::operator=(&local_1ec0,&local_1e68);
          wasm::Struct::~Struct(&local_1e68);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1e80);
          std::allocator<wasm::Field>::~allocator(&local_1ea9);
          local_1f18 = local_1e38.id;
          wasm::Field::Field(&local_1f10,local_1e38,Immutable);
          local_1f00 = &local_1f10;
          local_1ef8 = 1;
          std::allocator<wasm::Field>::allocator(&local_1f19);
          __l._M_len = local_1ef8;
          __l._M_array = local_1f00;
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    (&local_1ef0,__l,&local_1f19);
          wasm::Struct::Struct(&local_1ed8,&local_1ef0);
          local_1f30 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0_1,1);
          wasm::TypeBuilder::Entry::operator=(&local_1f30,&local_1ed8);
          wasm::Struct::~Struct(&local_1ed8);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1ef0);
          std::allocator<wasm::Field>::~allocator(&local_1f19);
          local_1f40 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0_1,1);
          EVar8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&ref0_1,0);
          results_4.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = EVar8.builder;
          HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                            ((Entry *)((long)&results_4.
                                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                              .
                                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                              .
                                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                              .
                                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                              .
                                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                              .
                                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      + 0x18));
          wasm::TypeBuilder::Entry::subTypeOf(&local_1f40,HVar4);
          wasm::TypeBuilder::build();
          testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                    ((AssertionResult *)local_1f88,(BuildResult *)&gtest_ar__11.message_,(type *)0x0
                    );
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f88);
          if (!bVar1) {
            testing::Message::Message(&local_1f90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &built_4.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1f88,
                       (AssertionResult *)"results","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x33a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1f98,&local_1f90);
            testing::internal::AssertHelper::~AssertHelper(&local_1f98);
            std::__cxx11::string::~string
                      ((string *)
                       &built_4.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_1f90);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f88);
          if (bVar1) {
            pvVar5 = wasm::TypeBuilder::BuildResult::operator*
                               ((BuildResult *)&gtest_ar__11.message_);
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &gtest_ar__12.message_,pvVar5);
            pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                               ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                &gtest_ar__12.message_,1);
            local_1ff0.id = pvVar6->id;
            pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                               ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                &gtest_ar__12.message_,0);
            local_1ff8 = pvVar6->id;
            bVar2 = wasm::HeapType::isSubType(local_1ff0,(HeapType)local_1ff8);
            local_1fe1 = (bool)(bVar2 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1fe0,&local_1fe1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fe0);
            if (!bVar1) {
              testing::Message::Message(&local_2000);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_2028,(internal *)local_1fe0,
                         (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true"
                         ,in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2008,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0x33c,pcVar3);
              testing::internal::AssertHelper::operator=(&local_2008,&local_2000);
              testing::internal::AssertHelper::~AssertHelper(&local_2008);
              std::__cxx11::string::~string((string *)&local_2028);
              testing::Message::~Message(&local_2000);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fe0);
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &gtest_ar__12.message_);
          }
          wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__11.message_);
          wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&ref0_1);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(IsorecursiveTest, TestHeapTypeRelations) {
  HeapType ext = HeapType::ext;
  HeapType func = HeapType::func;
  HeapType any = HeapType::any;
  HeapType eq = HeapType::eq;
  HeapType i31 = HeapType::i31;
  HeapType struct_ = HeapType::struct_;
  HeapType array = HeapType::array;
  HeapType string = HeapType::string;
  HeapType stringview_wtf8 = HeapType::stringview_wtf8;
  HeapType stringview_wtf16 = HeapType::stringview_wtf16;
  HeapType stringview_iter = HeapType::stringview_iter;
  HeapType none = HeapType::none;
  HeapType noext = HeapType::noext;
  HeapType nofunc = HeapType::nofunc;
  HeapType defFunc = Signature();
  HeapType defStruct = Struct();
  HeapType defArray = Array(Field(Type::i32, Immutable));

  auto assertLUB = [](HeapType a, HeapType b, std::optional<HeapType> lub) {
    auto lub1 = HeapType::getLeastUpperBound(a, b);
    auto lub2 = HeapType::getLeastUpperBound(b, a);
    EXPECT_EQ(lub, lub1);
    EXPECT_EQ(lub1, lub2);
    if (a == b) {
      EXPECT_TRUE(HeapType::isSubType(a, b));
      EXPECT_TRUE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else if (lub && *lub == b) {
      EXPECT_TRUE(HeapType::isSubType(a, b));
      EXPECT_FALSE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else if (lub && *lub == a) {
      EXPECT_FALSE(HeapType::isSubType(a, b));
      EXPECT_TRUE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else if (lub) {
      EXPECT_FALSE(HeapType::isSubType(a, b));
      EXPECT_FALSE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else {
      EXPECT_FALSE(HeapType::isSubType(a, b));
      EXPECT_FALSE(HeapType::isSubType(b, a));
      EXPECT_NE(a.getBottom(), b.getBottom());
    }
  };

  assertLUB(ext, ext, ext);
  assertLUB(ext, func, {});
  assertLUB(ext, any, {});
  assertLUB(ext, eq, {});
  assertLUB(ext, i31, {});
  assertLUB(ext, struct_, {});
  assertLUB(ext, array, {});
  assertLUB(ext, string, {});
  assertLUB(ext, stringview_wtf8, {});
  assertLUB(ext, stringview_wtf16, {});
  assertLUB(ext, stringview_iter, {});
  assertLUB(ext, none, {});
  assertLUB(ext, noext, ext);
  assertLUB(ext, nofunc, {});
  assertLUB(ext, defFunc, {});
  assertLUB(ext, defStruct, {});
  assertLUB(ext, defArray, {});

  assertLUB(func, func, func);
  assertLUB(func, any, {});
  assertLUB(func, eq, {});
  assertLUB(func, i31, {});
  assertLUB(func, struct_, {});
  assertLUB(func, array, {});
  assertLUB(func, string, {});
  assertLUB(func, stringview_wtf8, {});
  assertLUB(func, stringview_wtf16, {});
  assertLUB(func, stringview_iter, {});
  assertLUB(func, none, {});
  assertLUB(func, noext, {});
  assertLUB(func, nofunc, func);
  assertLUB(func, defFunc, func);
  assertLUB(func, defStruct, {});
  assertLUB(func, defArray, {});

  assertLUB(any, any, any);
  assertLUB(any, eq, any);
  assertLUB(any, i31, any);
  assertLUB(any, struct_, any);
  assertLUB(any, array, any);
  assertLUB(any, string, any);
  assertLUB(any, stringview_wtf8, any);
  assertLUB(any, stringview_wtf16, any);
  assertLUB(any, stringview_iter, any);
  assertLUB(any, none, any);
  assertLUB(any, noext, {});
  assertLUB(any, nofunc, {});
  assertLUB(any, defFunc, {});
  assertLUB(any, defStruct, any);
  assertLUB(any, defArray, any);

  assertLUB(eq, eq, eq);
  assertLUB(eq, i31, eq);
  assertLUB(eq, struct_, eq);
  assertLUB(eq, array, eq);
  assertLUB(eq, string, any);
  assertLUB(eq, stringview_wtf8, any);
  assertLUB(eq, stringview_wtf16, any);
  assertLUB(eq, stringview_iter, any);
  assertLUB(eq, none, eq);
  assertLUB(eq, noext, {});
  assertLUB(eq, nofunc, {});
  assertLUB(eq, defFunc, {});
  assertLUB(eq, defStruct, eq);
  assertLUB(eq, defArray, eq);

  assertLUB(i31, i31, i31);
  assertLUB(i31, struct_, eq);
  assertLUB(i31, array, eq);
  assertLUB(i31, string, any);
  assertLUB(i31, stringview_wtf8, any);
  assertLUB(i31, stringview_wtf16, any);
  assertLUB(i31, stringview_iter, any);
  assertLUB(i31, none, i31);
  assertLUB(i31, noext, {});
  assertLUB(i31, nofunc, {});
  assertLUB(i31, defFunc, {});
  assertLUB(i31, defStruct, eq);
  assertLUB(i31, defArray, eq);

  assertLUB(struct_, struct_, struct_);
  assertLUB(struct_, array, eq);
  assertLUB(struct_, string, any);
  assertLUB(struct_, stringview_wtf8, any);
  assertLUB(struct_, stringview_wtf16, any);
  assertLUB(struct_, stringview_iter, any);
  assertLUB(struct_, none, struct_);
  assertLUB(struct_, noext, {});
  assertLUB(struct_, nofunc, {});
  assertLUB(struct_, defFunc, {});
  assertLUB(struct_, defStruct, struct_);
  assertLUB(struct_, defArray, eq);

  assertLUB(array, array, array);
  assertLUB(array, string, any);
  assertLUB(array, stringview_wtf8, any);
  assertLUB(array, stringview_wtf16, any);
  assertLUB(array, stringview_iter, any);
  assertLUB(array, none, array);
  assertLUB(array, noext, {});
  assertLUB(array, nofunc, {});
  assertLUB(array, defFunc, {});
  assertLUB(array, defStruct, eq);
  assertLUB(array, defArray, array);

  assertLUB(string, string, string);
  assertLUB(string, stringview_wtf8, any);
  assertLUB(string, stringview_wtf16, any);
  assertLUB(string, stringview_iter, any);
  assertLUB(string, none, string);
  assertLUB(string, noext, {});
  assertLUB(string, nofunc, {});
  assertLUB(string, defFunc, {});
  assertLUB(string, defStruct, any);
  assertLUB(string, defArray, any);

  assertLUB(stringview_wtf8, stringview_wtf8, stringview_wtf8);
  assertLUB(stringview_wtf8, stringview_wtf16, any);
  assertLUB(stringview_wtf8, stringview_iter, any);
  assertLUB(stringview_wtf8, none, stringview_wtf8);
  assertLUB(stringview_wtf8, noext, {});
  assertLUB(stringview_wtf8, nofunc, {});
  assertLUB(stringview_wtf8, defFunc, {});
  assertLUB(stringview_wtf8, defStruct, any);
  assertLUB(stringview_wtf8, defArray, any);

  assertLUB(stringview_wtf16, stringview_wtf16, stringview_wtf16);
  assertLUB(stringview_wtf16, stringview_iter, any);
  assertLUB(stringview_wtf16, none, stringview_wtf16);
  assertLUB(stringview_wtf16, noext, {});
  assertLUB(stringview_wtf16, nofunc, {});
  assertLUB(stringview_wtf16, defFunc, {});
  assertLUB(stringview_wtf16, defStruct, any);
  assertLUB(stringview_wtf16, defArray, any);

  assertLUB(stringview_iter, stringview_iter, stringview_iter);
  assertLUB(stringview_iter, none, stringview_iter);
  assertLUB(stringview_iter, noext, {});
  assertLUB(stringview_iter, nofunc, {});
  assertLUB(stringview_iter, defFunc, {});
  assertLUB(stringview_iter, defStruct, any);
  assertLUB(stringview_iter, defArray, any);

  assertLUB(none, none, none);
  assertLUB(none, noext, {});
  assertLUB(none, nofunc, {});
  assertLUB(none, defFunc, {});
  assertLUB(none, defStruct, defStruct);
  assertLUB(none, defArray, defArray);

  assertLUB(noext, noext, noext);
  assertLUB(noext, nofunc, {});
  assertLUB(noext, defFunc, {});
  assertLUB(noext, defStruct, {});
  assertLUB(noext, defArray, {});

  assertLUB(nofunc, nofunc, nofunc);
  assertLUB(nofunc, defFunc, defFunc);
  assertLUB(nofunc, defStruct, {});
  assertLUB(nofunc, defArray, {});

  assertLUB(defFunc, defFunc, defFunc);
  assertLUB(defFunc, defStruct, {});
  assertLUB(defFunc, defArray, {});

  assertLUB(defStruct, defStruct, defStruct);
  assertLUB(defStruct, defArray, eq);

  assertLUB(defArray, defArray, defArray);

  Type anyref = Type(any, Nullable);
  Type eqref = Type(eq, Nullable);

  {
    // Nullable and non-nullable references.
    Type nonNullable(any, NonNullable);
    EXPECT_TRUE(Type::isSubType(nonNullable, anyref));
    EXPECT_FALSE(Type::isSubType(anyref, nonNullable));
    EXPECT_TRUE(Type::hasLeastUpperBound(anyref, nonNullable));
    EXPECT_EQ(Type::getLeastUpperBound(anyref, nonNullable), anyref);
  }

  {
    // Immutable array fields are covariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Immutable));
    builder[1] = Array(Field(eqref, Immutable));
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }

  {
    // Depth subtyping
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable)});
    builder[1] = Struct({Field(eqref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }

  {
    // Width subtyping
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable)});
    builder[1] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }

  {
    // Nested structs
    TypeBuilder builder(4);
    auto ref0 = builder.getTempRefType(builder[0], Nullable);
    auto ref1 = builder.getTempRefType(builder[1], Nullable);
    builder[0] = Struct({Field(anyref, Immutable)});
    builder[1] = Struct({Field(eqref, Immutable)});
    builder[2] = Struct({Field(ref0, Immutable)});
    builder[3] = Struct({Field(ref1, Immutable)});
    builder[1].subTypeOf(builder[0]);
    builder[3].subTypeOf(builder[2]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[3], built[2]));
  }

  {
    // Recursive structs
    TypeBuilder builder(2);
    auto ref0 = builder.getTempRefType(builder[0], Nullable);
    auto ref1 = builder.getTempRefType(builder[1], Nullable);
    builder[0] = Struct({Field(ref0, Immutable)});
    builder[1] = Struct({Field(ref1, Immutable)});
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }
}